

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThreeBBShaft.cpp
# Opt level: O2

double __thiscall chrono::ChConstraintThreeBBShaft::Compute_Cq_q(ChConstraintThreeBBShaft *this)

{
  double dVar1;
  undefined1 auVar2 [16];
  ChVariables *pCVar3;
  Scalar *pSVar4;
  double dVar5;
  Scalar SVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  MatrixBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  local_40 [24];
  Product<Eigen::Matrix<double,_1,_6,_1,_1,_6>,_Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
  local_28;
  
  pCVar3 = (this->super_ChConstraintThree).variables_a;
  dVar5 = 0.0;
  if (pCVar3->disabled == false) {
    ChVariables::Get_qb((ChVectorRef *)local_40,pCVar3);
    local_28 = Eigen::MatrixBase<Eigen::Matrix<double,1,6,1,1,6>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,1,6,1,1,6>> *)&this->Cq_a,local_40);
    SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)&local_28);
    dVar5 = SVar6 + 0.0;
  }
  pCVar3 = (this->super_ChConstraintThree).variables_b;
  if (pCVar3->disabled == false) {
    ChVariables::Get_qb((ChVectorRef *)local_40,pCVar3);
    local_28 = Eigen::MatrixBase<Eigen::Matrix<double,1,6,1,1,6>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,1,6,1,1,6>> *)&this->Cq_b,local_40);
    SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)&local_28);
    dVar5 = dVar5 + SVar6;
  }
  pCVar3 = (this->super_ChConstraintThree).variables_c;
  if (pCVar3->disabled == false) {
    dVar1 = (this->Cq_c).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_1,_1,_1>_>.m_storage.
            m_data.array[0];
    ChVariables::Get_qb((ChVectorRef *)local_40,pCVar3);
    pSVar4 = Eigen::
             DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
             ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                           *)local_40,0);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar5;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *pSVar4;
    auVar2 = vfmadd231sd_fma(auVar7,auVar8,auVar2);
    dVar5 = auVar2._0_8_;
  }
  return dVar5;
}

Assistant:

double ChConstraintThreeBBShaft::Compute_Cq_q() {
    double ret = 0;

    if (variables_a->IsActive()) {
        ret += Cq_a * variables_a->Get_qb();
    }

    if (variables_b->IsActive()) {
        ret += Cq_b * variables_b->Get_qb();
    }

    if (variables_c->IsActive()) {
        ret += Cq_c(0) * variables_c->Get_qb()(0);
    }

    return ret;
}